

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O1

void math::matrix_svd<double,3,3>
               (Matrix<double,_3,_3> *mat_a,Matrix<double,_3,_3> *mat_u,Matrix<double,_3,_3> *mat_s,
               Matrix<double,_3,_3> *mat_v,double *epsilon)

{
  undefined8 uVar1;
  long lVar2;
  
  matrix_svd<double>(mat_a->m,3,3,mat_u->m,mat_s->m,mat_v->m,epsilon);
  if (mat_s != (Matrix<double,_3,_3> *)0x0) {
    mat_s->m[7] = 0.0;
    mat_s->m[8] = 0.0;
    mat_s->m[5] = 0.0;
    mat_s->m[6] = 0.0;
    mat_s->m[3] = 0.0;
    mat_s->m[4] = 0.0;
    lVar2 = 8;
    do {
      uVar1 = *(undefined8 *)((long)mat_s->m + lVar2);
      *(undefined8 *)((long)mat_s->m + lVar2) = *(undefined8 *)((long)mat_s->m + lVar2 * 4);
      *(undefined8 *)((long)mat_s->m + lVar2 * 4) = uVar1;
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x18);
  }
  return;
}

Assistant:

void
matrix_svd (Matrix<T, M, N> const& mat_a, Matrix<T, M, N>* mat_u,
    Matrix<T, N, N>* mat_s, Matrix<T, N, N>* mat_v, T const& epsilon)
{
    T* mat_u_ptr = mat_u ? mat_u->begin() : nullptr;
    T* mat_s_ptr = mat_s ? mat_s->begin() : nullptr;
    T* mat_v_ptr = mat_v ? mat_v->begin() : nullptr;

    matrix_svd<T>(mat_a.begin(), M, N,
        mat_u_ptr, mat_s_ptr, mat_v_ptr, epsilon);

    /* Swap elements of S into place. */
    if (mat_s_ptr)
    {
        std::fill(mat_s_ptr + N, mat_s_ptr + N * N, T(0));
        for (int x = 1, i = N + 1; x < N; ++x, i += N + 1)
            std::swap(mat_s_ptr[x], mat_s_ptr[i]);
    }
}